

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O0

bool isItAFunction<CyclicHash<unsigned_int,unsigned_char>>(uint L)

{
  bool bVar1;
  uint32_conflict uVar2;
  uint uVar3;
  reference pvVar4;
  reference puVar5;
  ostream *poVar6;
  void *pvVar7;
  byte *pbVar8;
  uint local_187c;
  undefined1 local_1878 [4];
  uint j;
  undefined1 local_1858 [8];
  iterator ii;
  uint local_1830;
  char c_1;
  uchar out;
  uint32_conflict k_1;
  uchar local_181d;
  uint local_181c;
  undefined1 local_1818 [3];
  uchar c;
  uint32_conflict k;
  deque<unsigned_char,_std::allocator<unsigned_char>_> s;
  CyclicHash<unsigned_int,_unsigned_char> hf;
  uint n;
  mersenneRNG generator;
  uint L_local;
  
  mersenneRNG::mersenneRNG((mersenneRNG *)&hf.maskn,5);
  hf.myr = 3;
  CyclicHash<unsigned_int,_unsigned_char>::CyclicHash
            ((CyclicHash<unsigned_int,_unsigned_char> *)
             ((long)&s.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_node + 4),3,L);
  std::deque<unsigned_char,_std::allocator<unsigned_char>_>::deque
            ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1818);
  for (local_181c = 0; local_181c < 3; local_181c = local_181c + 1) {
    uVar2 = mersenneRNG::operator()((mersenneRNG *)&hf.maskn);
    local_181d = (char)uVar2 + 'A';
    std::deque<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1818,&local_181d);
    CyclicHash<unsigned_int,_unsigned_char>::eat
              ((CyclicHash<unsigned_int,_unsigned_char> *)
               ((long)&s.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Deque_impl_data._M_finish._M_node + 4),local_181d);
  }
  local_1830 = 0;
  do {
    if (99999 < local_1830) {
      generator._5015_1_ = 1;
LAB_00105497:
      std::deque<unsigned_char,_std::allocator<unsigned_char>_>::~deque
                ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1818);
      return (bool)generator._5015_1_;
    }
    pvVar4 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::front
                       ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1818);
    ii._M_node._7_1_ = *pvVar4;
    std::deque<unsigned_char,_std::allocator<unsigned_char>_>::pop_front
              ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1818);
    uVar2 = mersenneRNG::operator()((mersenneRNG *)&hf.maskn);
    ii._M_node._5_1_ = (char)uVar2 + 'A';
    ii._M_node._6_1_ = ii._M_node._5_1_;
    std::deque<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1818,
               (value_type *)((long)&ii._M_node + 5));
    CyclicHash<unsigned_int,_unsigned_char>::update
              ((CyclicHash<unsigned_int,_unsigned_char> *)
               ((long)&s.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Deque_impl_data._M_finish._M_node + 4),ii._M_node._7_1_,
               ii._M_node._6_1_);
    uVar3 = CyclicHash<unsigned_int,unsigned_char>::
            hash<std::deque<unsigned_char,std::allocator<unsigned_char>>>
                      ((CyclicHash<unsigned_int,unsigned_char> *)
                       ((long)&s.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Deque_impl_data._M_finish._M_node + 4),
                       (deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1818);
    if (uVar3 != s.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_node._4_4_) {
      std::deque<unsigned_char,_std::allocator<unsigned_char>_>::begin
                ((iterator *)local_1858,
                 (deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1818);
      while( true ) {
        std::deque<unsigned_char,_std::allocator<unsigned_char>_>::end
                  ((iterator *)local_1878,
                   (deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1818);
        bVar1 = std::operator!=((_Self *)local_1858,(_Self *)local_1878);
        if (!bVar1) break;
        puVar5 = std::_Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*>::operator*
                           ((_Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*> *)
                            local_1858);
        poVar6 = std::operator<<((ostream *)&std::cout,*puVar5);
        poVar6 = std::operator<<(poVar6," ");
        pbVar8 = std::_Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*>::operator*
                           ((_Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*> *)
                            local_1858);
        pvVar7 = (void *)std::ostream::operator<<(poVar6,(uint)*pbVar8);
        std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
        std::_Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*>::operator++
                  ((_Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*> *)local_1858);
      }
      poVar6 = std::operator<<((ostream *)&std::cerr,"bug");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      pvVar4 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1818,0);
      poVar6 = std::operator<<((ostream *)&std::cerr,*pvVar4);
      pvVar4 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1818,1);
      poVar6 = std::operator<<(poVar6,*pvVar4);
      pvVar4 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1818,2);
      poVar6 = std::operator<<(poVar6,*pvVar4);
      poVar6 = std::operator<<(poVar6," was hashed to ");
      poVar6 = (ostream *)
               std::ostream::operator<<
                         (poVar6,s.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Deque_impl_data._M_finish._M_node._4_4_);
      poVar6 = std::operator<<(poVar6," when true hash value is ");
      uVar3 = CyclicHash<unsigned_int,unsigned_char>::
              hash<std::deque<unsigned_char,std::allocator<unsigned_char>>>
                        ((CyclicHash<unsigned_int,unsigned_char> *)
                         ((long)&s.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Deque_impl_data._M_finish._M_node + 4),
                         (deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1818);
      pvVar7 = (void *)std::ostream::operator<<(poVar6,uVar3);
      std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
      for (local_187c = 0; local_187c < 3; local_187c = local_187c + 1) {
        pvVar4 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1818,
                            (ulong)local_187c);
        poVar6 = std::operator<<((ostream *)&std::cerr,*pvVar4);
        poVar6 = std::operator<<(poVar6,"->");
        pbVar8 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)local_1818,
                            (ulong)local_187c);
        pvVar7 = (void *)std::ostream::operator<<(poVar6,hf.hasher.hashvalues[(ulong)*pbVar8 - 2]);
        std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
      }
      generator._5015_1_ = 0;
      goto LAB_00105497;
    }
    local_1830 = local_1830 + 1;
  } while( true );
}

Assistant:

bool isItAFunction(uint L = 7) {
  mersenneRNG generator(5);
  const uint n(3); // n-grams
  hashfunction hf(n, L);
  deque<unsigned char> s;
  for (uint32 k = 0; k < n; ++k) {
    unsigned char c = static_cast<unsigned char>(generator() + 65);
    s.push_back(c);
    hf.eat(c);
  }
  for (uint32 k = 0; k < 100000; ++k) {
    unsigned char out = s.front();
    s.pop_front();
    char c(generator() + 65);

    s.push_back(c);
    hf.update(out, c);
    if (hf.hash(s) != hf.hashvalue) {
      for (deque<unsigned char>::iterator ii = s.begin(); ii != s.end(); ++ii)
        cout << *ii << " " << static_cast<uint32>(*ii) << endl;
      cerr << "bug" << endl;
      cerr << s[0] << s[1] << s[2] << " was hashed to " << hf.hashvalue
           << " when true hash value is " << hf.hash(s) << endl;
      for (uint j = 0; j < n; ++j)
        cerr << s[j] << "->" << hf.hasher.hashvalues[s[j]] << endl;
      return false;
    }
  }
  return true;
}